

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

xmlBufPtr xmlBufCreateStatic(void *mem,size_t size)

{
  xmlBufPtr ret;
  size_t size_local;
  void *mem_local;
  
  if (mem == (void *)0x0) {
    mem_local = (void *)0x0;
  }
  else {
    mem_local = (*xmlMalloc)(0x40);
    if ((undefined8 *)mem_local == (undefined8 *)0x0) {
      xmlBufMemoryError((xmlBufPtr)0x0,"creating buffer");
      mem_local = (void *)0x0;
    }
    else {
      *(size_t *)((long)mem_local + 0x20) = size;
      *(size_t *)((long)mem_local + 0x28) = size;
      if (*(ulong *)((long)mem_local + 0x28) < 0x7fffffff) {
        *(int *)((long)mem_local + 0xc) = (int)*(undefined8 *)((long)mem_local + 0x28);
      }
      else {
        *(undefined4 *)((long)mem_local + 0xc) = 0x7fffffff;
      }
      if (*(ulong *)((long)mem_local + 0x20) < 0x7fffffff) {
        *(int *)((long)mem_local + 8) = (int)*(undefined8 *)((long)mem_local + 0x20);
      }
      else {
        *(undefined4 *)((long)mem_local + 8) = 0x7fffffff;
      }
      *(undefined4 *)((long)mem_local + 0x10) = 2;
      *(void **)mem_local = mem;
      *(undefined4 *)((long)mem_local + 0x38) = 0;
      *(undefined8 *)((long)mem_local + 0x30) = 0;
    }
  }
  return (xmlBufPtr)mem_local;
}

Assistant:

xmlBufPtr
xmlBufCreateStatic(void *mem, size_t size) {
    xmlBufPtr ret;

    if (mem == NULL)
        return(NULL);

    ret = (xmlBufPtr) xmlMalloc(sizeof(xmlBuf));
    if (ret == NULL) {
	xmlBufMemoryError(NULL, "creating buffer");
        return(NULL);
    }
    ret->use = size;
    ret->size = size;
    UPDATE_COMPAT(ret);
    ret->alloc = XML_BUFFER_ALLOC_IMMUTABLE;
    ret->content = (xmlChar *) mem;
    ret->error = 0;
    ret->buffer = NULL;
    return(ret);
}